

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_want_read(nghttp2_session *session)

{
  size_t sVar1;
  long in_RDI;
  size_t num_active_streams;
  undefined4 local_4;
  
  if ((*(byte *)(in_RDI + 0xb75) & 2) == 0) {
    sVar1 = session_get_num_active_streams((nghttp2_session *)0x117cf1);
    if (sVar1 == 0) {
      local_4 = (uint)((*(byte *)(in_RDI + 0xb75) & 0xc) == 0);
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nghttp2_session_want_read(nghttp2_session *session) {
  size_t num_active_streams;

  /* If this flag is set, we don't want to read. The application
     should drop the connection. */
  if (session->goaway_flags & NGHTTP2_GOAWAY_TERM_SENT) {
    return 0;
  }

  num_active_streams = session_get_num_active_streams(session);

  /* Unless termination GOAWAY is sent or received, we always want to
     read incoming frames. */

  if (num_active_streams > 0) {
    return 1;
  }

  /* If there is no active streams and GOAWAY has been sent or
     received, we are done with this session. */
  return (session->goaway_flags &
          (NGHTTP2_GOAWAY_SENT | NGHTTP2_GOAWAY_RECV)) == 0;
}